

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_tracek(lua_State *L)

{
  int32_t iVar1;
  uint uVar2;
  TValue *pTVar3;
  ushort *puVar4;
  lua_State *in_RDI;
  int32_t slot;
  IRIns *ir;
  IRRef ref;
  GCtrace *T;
  uint local_44;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_20;
  
  pTVar3 = (TValue *)
           jit_checktrace((lua_State *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                         );
  iVar1 = lj_lib_checkint((lua_State *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                          ,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  uVar2 = iVar1 + 0x8000;
  if (((pTVar3 == (TValue *)0x0) || (uVar2 < pTVar3[3].u32.lo)) || (0x7fff < uVar2)) {
    local_20 = 0;
  }
  else {
    puVar4 = (ushort *)(pTVar3[2].u64 + (ulong)uVar2 * 8);
    local_44 = 0xffffffff;
    if (*(char *)((long)puVar4 + 5) == '\x1d') {
      local_44 = (uint)puVar4[1];
      puVar4 = (ushort *)(pTVar3[2].u64 + (ulong)*puVar4 * 8);
    }
    lj_ir_kvalue(in_RDI,pTVar3,(IRIns *)CONCAT44(uVar2,in_stack_ffffffffffffffc8));
    in_RDI->top[-1].n = (double)((byte)puVar4[2] & 0x1f);
    if (local_44 == 0xffffffff) {
      local_20 = 2;
    }
    else {
      pTVar3 = in_RDI->top;
      in_RDI->top = pTVar3 + 1;
      pTVar3->n = (double)(int)local_44;
      local_20 = 3;
    }
  }
  return local_20;
}

Assistant:

LJLIB_CF(jit_util_tracek)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= T->nk && ref < REF_BIAS) {
    IRIns *ir = &T->ir[ref];
    int32_t slot = -1;
    if (ir->o == IR_KSLOT) {
      slot = ir->op2;
      ir = &T->ir[ir->op1];
    }
    lj_ir_kvalue(L, L->top-2, ir);
    setintV(L->top-1, (int32_t)irt_type(ir->t));
    if (slot == -1)
      return 2;
    setintV(L->top++, slot);
    return 3;
  }
  return 0;
}